

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3DefaultRowEst(Index *pIdx)

{
  short *psVar1;
  uint local_34;
  uint local_30;
  int i;
  int nCopy;
  LogEst *a;
  LogEst aVal [5];
  Index *pIdx_local;
  
  stack0xffffffffffffffe6 = 0x1c001e00200021;
  aVal[0] = 0x1a;
  psVar1 = pIdx->aiRowLogEst;
  if (pIdx->nKeyCol < 6) {
    local_34 = (uint)pIdx->nKeyCol;
  }
  else {
    local_34 = 5;
  }
  *psVar1 = pIdx->pTable->nRowLogEst;
  if (pIdx->pPartIdxWhere != (Expr *)0x0) {
    *psVar1 = *psVar1 + -10;
  }
  if (*psVar1 < 0x21) {
    *psVar1 = 0x21;
  }
  aVal._2_8_ = pIdx;
  memcpy(psVar1 + 1,(void *)((long)&a + 6),(long)(int)local_34 << 1);
  while (local_30 = local_34 + 1, (int)local_30 <= (int)(uint)*(ushort *)(aVal._2_8_ + 0x5e)) {
    psVar1[(int)local_30] = 0x17;
    local_34 = local_30;
  }
  if (*(char *)(aVal._2_8_ + 0x62) != '\0') {
    psVar1[*(ushort *)(aVal._2_8_ + 0x5e)] = 0;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DefaultRowEst(Index *pIdx){
  /*                10,  9,  8,  7,  6 */
  LogEst aVal[] = { 33, 32, 30, 28, 26 };
  LogEst *a = pIdx->aiRowLogEst;
  int nCopy = MIN(ArraySize(aVal), pIdx->nKeyCol);
  int i;

  /* Set the first entry (number of rows in the index) to the estimated 
  ** number of rows in the table, or half the number of rows in the table
  ** for a partial index.   But do not let the estimate drop below 10. */
  a[0] = pIdx->pTable->nRowLogEst;
  if( pIdx->pPartIdxWhere!=0 ) a[0] -= 10;  assert( 10==sqlite3LogEst(2) );
  if( a[0]<33 ) a[0] = 33;                  assert( 33==sqlite3LogEst(10) );

  /* Estimate that a[1] is 10, a[2] is 9, a[3] is 8, a[4] is 7, a[5] is
  ** 6 and each subsequent value (if any) is 5.  */
  memcpy(&a[1], aVal, nCopy*sizeof(LogEst));
  for(i=nCopy+1; i<=pIdx->nKeyCol; i++){
    a[i] = 23;                    assert( 23==sqlite3LogEst(5) );
  }

  assert( 0==sqlite3LogEst(1) );
  if( IsUniqueIndex(pIdx) ) a[pIdx->nKeyCol] = 0;
}